

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int flatcc_verify_table_vector_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              flatcc_table_verifier_f *tvf)

{
  flatbuffers_uoffset_t end;
  flatbuffers_uoffset_t offset;
  void *buf;
  int iVar1;
  int iVar2;
  int iVar3;
  uint base_00;
  ulong uVar4;
  flatbuffers_uoffset_t base;
  
  iVar1 = get_offset_field(td,id,required,&base);
  if (base != 0 && iVar1 == 0) {
    iVar3 = td->ttl;
    if (iVar3 < 1) {
      iVar1 = 3;
    }
    else {
      buf = td->buf;
      end = td->end;
      offset = *(flatbuffers_uoffset_t *)((long)buf + (ulong)base);
      iVar1 = verify_vector(buf,end,base,offset,4,4,0x3fffffff);
      if (iVar1 == 0) {
        iVar3 = iVar3 + -1;
        uVar4 = (ulong)(offset + base);
        iVar1 = *(int *)((long)buf + uVar4) + 1;
        while (iVar1 = iVar1 + -1, iVar1 != 0) {
          base_00 = (int)uVar4 + 4;
          uVar4 = (ulong)base_00;
          iVar2 = verify_table(buf,end,base_00,*(flatbuffers_uoffset_t *)((long)buf + uVar4),iVar3,
                               tvf);
          if (iVar2 != 0) {
            iVar1 = verify_table(buf,end,base_00,*(flatbuffers_uoffset_t *)((long)buf + uVar4),iVar3
                                 ,tvf);
            return iVar1;
          }
        }
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int flatcc_verify_table_vector_field(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, flatcc_table_verifier_f tvf)
{
    uoffset_t base;

    check_field(td, id, required, base);
    return verify_table_vector(td->buf, td->end, base, read_uoffset(td->buf, base), td->ttl, tvf);
}